

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

bool __thiscall
Js::InterpreterStackFrame::CheckAndResetImplicitCall
          (InterpreterStackFrame *this,DisableImplicitFlags prevDisableImplicitFlags,
          ImplicitCallFlags savedImplicitCallFlags)

{
  ImplicitCallFlags IVar1;
  ThreadContext *pTVar2;
  ImplicitCallFlags curImplicitCallFlags;
  ImplicitCallFlags savedImplicitCallFlags_local;
  DisableImplicitFlags prevDisableImplicitFlags_local;
  InterpreterStackFrame *this_local;
  
  pTVar2 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
  IVar1 = ThreadContext::GetImplicitCallFlags(pTVar2);
  if (ImplicitCall_None < IVar1) {
    pTVar2 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
    ThreadContext::SetDisableImplicitFlags(pTVar2,prevDisableImplicitFlags);
    pTVar2 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
    ThreadContext::SetImplicitCallFlags(pTVar2,savedImplicitCallFlags);
  }
  return ImplicitCall_None < IVar1;
}

Assistant:

bool InterpreterStackFrame::CheckAndResetImplicitCall(DisableImplicitFlags prevDisableImplicitFlags, ImplicitCallFlags savedImplicitCallFlags)
    {
        ImplicitCallFlags curImplicitCallFlags = this->scriptContext->GetThreadContext()->GetImplicitCallFlags();
        if (curImplicitCallFlags > ImplicitCall_None)
        {
            //error implicit bit is set , reparse without asmjs
            this->scriptContext->GetThreadContext()->SetDisableImplicitFlags(prevDisableImplicitFlags);
            this->scriptContext->GetThreadContext()->SetImplicitCallFlags(savedImplicitCallFlags);
            return true;
        }
        return false;
    }